

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CullingTestInstance *this)

{
  float *pfVar1;
  ostringstream *poVar2;
  deUint32 width;
  VkPrimitiveTopology VVar3;
  pointer pVVar4;
  bool bVar5;
  bool bVar6;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  reference pvVar7;
  MessageBuilder *pMVar8;
  NotSupportedError *this_00;
  uint uVar9;
  long lVar10;
  Vec4 *pVVar11;
  Vec4 *pVVar12;
  int vtxNdx_1;
  CullingTestInstance *pCVar13;
  int vtxNdx;
  int iVar14;
  long lVar15;
  int triNdx;
  size_type sVar16;
  float fVar17;
  allocator<char> local_371;
  CullingTestInstance *local_370;
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_368;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  _Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
  local_328;
  _Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
  local_308;
  long local_2e8;
  RasterizationArguments local_2dc;
  Surface resultImage;
  IVec4 colorBits;
  SceneTriangle tri;
  VkPhysicalDeviceFeatures deviceFeatures;
  
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&resultImage,width,width);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vk = Context::getInstanceInterface
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures(&deviceFeatures,vk,physicalDevice);
  if ((deviceFeatures.fillModeNonSolid == 0) && (this->m_polygonMode - VK_POLYGON_MODE_LINE < 2)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Wireframe fill modes are not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0x80c);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  deRandom_init((deRandom *)&tri,0x849ea);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(&drawBuffer,6)
  ;
  lVar10 = 0;
  local_370 = this;
  for (lVar15 = 0;
      lVar15 < (int)((ulong)((long)drawBuffer.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4);
      lVar15 = lVar15 + 1) {
    fVar17 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10) =
         fVar17 * 1.8 + -0.9;
    fVar17 = deRandom_getFloat((deRandom *)&tri);
    *(float *)((long)(drawBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 4) =
         fVar17 * 1.8 + -0.9;
    *(undefined8 *)
     ((long)(drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_data + lVar10 + 8) = 0x3f80000000000000;
    lVar10 = lVar10 + 0x10;
  }
  if (local_370->m_cullMode != 3) {
    bVar6 = (local_370->m_cullMode == 1) !=
            (local_370->m_frontFace == VK_FRONT_FACE_COUNTER_CLOCKWISE);
    VVar3 = local_370->m_primitiveTopology;
    if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      iVar14 = 2;
      while( true ) {
        pVVar4 = drawBuffer.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar9 = iVar14 - 2;
        if ((int)((ulong)((long)drawBuffer.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)drawBuffer.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) + -2 <= (int)uVar9)
        break;
        pCVar13 = (CullingTestInstance *)
                  (drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (int)uVar9);
        pVVar12 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar9 + 1;
        pVVar11 = drawBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar14;
        bVar5 = triangleOrder(pCVar13,pVVar12,pVVar11,(Vec4 *)(ulong)uVar9);
        if (bVar6 != bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar13->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance;
          tri.positions[0].m_data._8_8_ =
               (pCVar13->super_BaseRenderingTestInstance).super_TestInstance.m_context;
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar12->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar4[(long)(int)uVar9 + 1].m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,&tri);
        }
        iVar14 = iVar14 + 3;
      }
    }
    else if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      local_2e8 = 0x200000000;
      lVar10 = 0x10;
      for (lVar15 = 0;
          pVVar4 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar15 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x200000000 >>
                   0x20; lVar15 = lVar15 + 1) {
        pVVar11 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar10);
        pCVar13 = (CullingTestInstance *)
                  ((long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar10);
        pVVar12 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data +
                          (local_2e8 >> 0x1c));
        bVar5 = triangleOrder(pCVar13,pVVar11,pVVar12,(Vec4 *)0xfffffffe00000000);
        if (((uint)lVar15 & 1 ^ (uint)bVar6) != (uint)bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ =
               (pCVar13->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)((long)pVVar4->m_data + lVar10 + -8);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar12->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar12->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,&tri);
        }
        local_2e8 = local_2e8 + 0x100000000;
        lVar10 = lVar10 + 0x10;
      }
    }
    else if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
      lVar15 = 0x20;
      for (lVar10 = 1;
          pVVar4 = drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          lVar10 < ((long)drawBuffer.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)drawBuffer.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) * 0x10000000 + -0x100000000 >>
                   0x20; lVar10 = lVar10 + 1) {
        pVVar11 = (Vec4 *)((long)(drawBuffer.
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
        pVVar12 = (Vec4 *)((long)drawBuffer.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_data + lVar15);
        bVar5 = triangleOrder((CullingTestInstance *)
                              drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,pVVar12,pVVar11,
                              (Vec4 *)0xffffffff00000000);
        if (bVar6 != bVar5) {
          tcu::TriangleSceneSpec::SceneTriangle::SceneTriangle(&tri);
          tri.positions[0].m_data._0_8_ = *(undefined8 *)pVVar4->m_data;
          tri.positions[0].m_data._8_8_ = *(undefined8 *)(pVVar4->m_data + 2);
          tri.sharedEdge[0] = false;
          tri.positions[1].m_data._0_8_ = *(undefined8 *)pVVar12->m_data;
          tri.positions[1].m_data._8_8_ = *(undefined8 *)((long)pVVar4->m_data + lVar15 + -8);
          tri.sharedEdge[1] = false;
          tri.positions[2].m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
          tri.positions[2].m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
          tri.sharedEdge[2] = false;
          std::
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,&tri);
        }
        lVar15 = lVar15 + 0x10;
      }
    }
  }
  if (local_370->m_polygonMode == VK_POLYGON_MODE_POINT) {
    for (sVar16 = 0;
        (long)sVar16 <
        (long)(int)(((long)local_368._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_368._M_impl.super__Vector_impl_data._M_start) / 100);
        sVar16 = sVar16 + 1) {
      for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 0x10) {
        tcu::PointSceneSpec::ScenePoint::ScenePoint((ScenePoint *)&tri);
        pvVar7 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::at((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,sVar16);
        pfVar1 = (float *)((long)pvVar7->positions[0].m_data + lVar10);
        tri.positions[0].m_data._0_8_ = *(undefined8 *)pfVar1;
        tri.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar1 + 2);
        tri.positions[2].m_data[0] = 1.0;
        std::
        vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
        push_back((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                   *)&local_308,(value_type *)&tri);
      }
    }
  }
  else if (local_370->m_polygonMode == VK_POLYGON_MODE_LINE) {
    for (sVar16 = 0;
        (long)sVar16 <
        (long)(int)(((long)local_368._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_368._M_impl.super__Vector_impl_data._M_start) / 100);
        sVar16 = sVar16 + 1) {
      for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 0x10) {
        tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)&tri);
        pvVar7 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::at((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,sVar16);
        pfVar1 = (float *)((long)pvVar7->positions[0].m_data + lVar10);
        tri.positions[0].m_data._0_8_ = *(undefined8 *)pfVar1;
        tri.positions[0].m_data._8_8_ = *(undefined8 *)(pfVar1 + 2);
        pvVar7 = std::
                 vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                 ::at((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                       *)&local_368,sVar16);
        pfVar1 = (float *)((long)pvVar7->positions[1].m_data + lVar10);
        tri.positions[1].m_data._0_8_ = *(undefined8 *)pfVar1;
        tri.positions[1].m_data._8_8_ = *(undefined8 *)(pfVar1 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   *)&local_328,(value_type *)&tri);
      }
      tcu::LineSceneSpec::SceneLine::SceneLine((SceneLine *)&tri);
      pvVar7 = std::
               vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ::at((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)&local_368,sVar16);
      tri.positions[0].m_data._0_8_ = *(undefined8 *)pvVar7->positions[2].m_data;
      tri.positions[0].m_data._8_8_ = *(undefined8 *)(pvVar7->positions[2].m_data + 2);
      pvVar7 = std::
               vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ::at((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)&local_368,sVar16);
      tri.positions[1].m_data._0_8_ = *(undefined8 *)pvVar7->positions[0].m_data;
      tri.positions[1].m_data._8_8_ = *(undefined8 *)(pvVar7->positions[0].m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                 *)&local_328,(value_type *)&tri);
    }
  }
  tri.positions[0].m_data._0_8_ =
       ((local_370->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  poVar2 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Setting front face to ");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&tri,&local_370->m_frontFace);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  tri.positions[0].m_data._0_8_ =
       ((local_370->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  poVar2 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Setting cull face to ");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&tri,&local_370->m_cullMode);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  tri.positions[0].m_data._0_8_ =
       ((local_370->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  poVar2 = (ostringstream *)(tri.positions[0].m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Drawing test pattern (");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&tri,&local_370->m_primitiveTopology);
  std::operator<<((ostream *)&pMVar8->m_str,")");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  pCVar13 = local_370;
  BaseRenderingTestInstance::drawPrimitives
            (&local_370->super_BaseRenderingTestInstance,&resultImage,&drawBuffer,
             local_370->m_primitiveTopology);
  tcu::getTextureFormatBitDepth
            ((tcu *)&colorBits,&(pCVar13->super_BaseRenderingTestInstance).m_textureFormat);
  local_2dc.numSamples = (int)pCVar13->m_multisampling;
  local_2dc.subpixelBits = (pCVar13->super_BaseRenderingTestInstance).m_subpixelBits;
  local_2dc.redBits = colorBits.m_data[0];
  local_2dc.greenBits = colorBits.m_data[1];
  local_2dc.blueBits = colorBits.m_data[2];
  if (pCVar13->m_polygonMode == VK_POLYGON_MODE_LINE) {
    tri.positions[1].m_data._8_8_ = tri.positions[1].m_data._8_8_ & 0xffffffff00000000;
    tri.positions[0].m_data._0_8_ = local_328._M_impl.super__Vector_impl_data._M_start;
    tri.positions[0].m_data._8_8_ = local_328._M_impl.super__Vector_impl_data._M_finish;
    tri.positions[1].m_data._0_8_ = local_328._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar6 = tcu::verifyLineGroupRasterization
                      (&resultImage,(LineSceneSpec *)&tri,&local_2dc,
                       ((pCVar13->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ::~_Vector_base((_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     *)&tri);
  }
  else if (pCVar13->m_polygonMode == VK_POLYGON_MODE_POINT) {
    tri.positions[0].m_data._0_8_ = local_308._M_impl.super__Vector_impl_data._M_start;
    tri.positions[0].m_data._8_8_ = local_308._M_impl.super__Vector_impl_data._M_finish;
    tri.positions[1].m_data._0_8_ = local_308._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_308._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar6 = tcu::verifyPointGroupRasterization
                      (&resultImage,(PointSceneSpec *)&tri,&local_2dc,
                       ((pCVar13->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    std::
    _Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ::~_Vector_base((_Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                     *)&tri);
  }
  else {
    tri.positions[0].m_data._0_8_ = local_368._M_impl.super__Vector_impl_data._M_start;
    tri.positions[0].m_data._8_8_ = local_368._M_impl.super__Vector_impl_data._M_finish;
    tri.positions[1].m_data._0_8_ = local_368._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar6 = tcu::verifyTriangleGroupRasterization
                      (&resultImage,(TriangleSceneSpec *)&tri,&local_2dc,
                       ((pCVar13->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log,VERIFICATIONMODE_WEAK);
    std::
    _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
    ::~_Vector_base((_Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)&tri);
  }
  if (bVar6 == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tri,"Incorrect rendering",&local_371);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&tri);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&tri,"Pass",&local_371);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&tri);
  }
  std::__cxx11::string::~string((string *)&tri);
  std::_Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~_Vector_base(&local_328);
  std::
  _Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  ~_Vector_base(&local_308);
  std::
  _Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::~_Vector_base(&local_368);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus CullingTestInstance::iterate (void)
{
	DE_ASSERT(m_polygonMode < VK_POLYGON_MODE_LAST);

	tcu::Surface									resultImage						(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;
	std::vector<PointSceneSpec::ScenePoint>			points;
	std::vector<LineSceneSpec::SceneLine>			lines;

	const InstanceInterface&						vk				= m_context.getInstanceInterface();
	const VkPhysicalDevice							physicalDevice	= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures					deviceFeatures	= getPhysicalDeviceFeatures(vk, physicalDevice);

	if (!(deviceFeatures.fillModeNonSolid) && (m_polygonMode == VK_POLYGON_MODE_LINE || m_polygonMode == VK_POLYGON_MODE_POINT))
		TCU_THROW(NotSupportedError, "Wireframe fill modes are not supported");

	// generate scene
	generateVertices(drawBuffer);
	extractTriangles(triangles, drawBuffer);

	if (m_polygonMode == VK_POLYGON_MODE_LINE)
		extractLines(triangles ,lines);
	else if (m_polygonMode == VK_POLYGON_MODE_POINT)
		extractPoints(triangles, points);

	// draw image
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting front face to " << m_frontFace << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Setting cull face to " << m_cullMode << tcu::TestLog::EndMessage;
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing test pattern (" << m_primitiveTopology << ")" << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);
	}

	// compare
	{
		RasterizationArguments	args;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());
		bool					isCompareOk	= false;

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		switch (m_polygonMode)
		{
			case VK_POLYGON_MODE_LINE:
			{
				LineSceneSpec scene;
				scene.lineWidth = 0;
				scene.lines.swap(lines);
				isCompareOk = verifyLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			case VK_POLYGON_MODE_POINT:
			{
				PointSceneSpec scene;
				scene.points.swap(points);
				isCompareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());
				break;
			}
			default:
			{
				TriangleSceneSpec scene;
				scene.triangles.swap(triangles);
				isCompareOk = verifyTriangleGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog(), tcu::VERIFICATIONMODE_WEAK);
				break;
			}
		}

		if (isCompareOk)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rendering");
	}
}